

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O1

uint __thiscall sjtu::TrainManager::bitset_newblock(TrainManager *this,uint y)

{
  ulong uVar1;
  int i;
  uint uVar2;
  uint bit;
  ofstream bitset;
  int local_234;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,"Bitset.dat",_S_out|_S_app);
  uVar1 = std::ostream::tellp();
  uVar2 = 0;
  do {
    local_234 = (uint)(y >> 5 == uVar2) << ((byte)y & 0x1f);
    std::ostream::write((char *)&local_230,(long)&local_234);
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x200);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _tellp;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return (uint)(uVar1 >> 0xb);
}

Assistant:

unsigned int bitset_newblock(unsigned int y)
		{
			std::ofstream bitset("Bitset.dat" , std::ios_base::out | std::ios_base::app);
			unsigned int ret = bitset.tellp() / sizeof (unsigned int) / WS;
			for (int i = 0;i < WS;++ i)
			{
				unsigned int bit = (i == y / W) << y % W;
				bitset.write(reinterpret_cast<char *> (&bit) , sizeof (unsigned int));
			}
			return ret;
		}